

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context_tree.c
# Opt level: O0

void av1_reset_pmc(PICK_MODE_CONTEXT *ctx)

{
  long in_RDI;
  
  memset(*(void **)(in_RDI + 0x118),0,(long)*(int *)(in_RDI + 0x1a0));
  memset(*(void **)(in_RDI + 0x198),0,(long)*(int *)(in_RDI + 0x1a0));
  av1_invalid_rd_stats((RD_STATS *)(in_RDI + 0x1a8));
  return;
}

Assistant:

void av1_reset_pmc(PICK_MODE_CONTEXT *ctx) {
  av1_zero_array(ctx->blk_skip, ctx->num_4x4_blk);
  av1_zero_array(ctx->tx_type_map, ctx->num_4x4_blk);
  av1_invalid_rd_stats(&ctx->rd_stats);
}